

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O3

void Handlers::Trade_Remove(Character *character,PacketReader *reader)

{
  bool bVar1;
  unsigned_short item;
  int iVar2;
  _List_node_base *p_Var3;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar4;
  PacketBuilder builder;
  PacketBuilder PStack_58;
  
  if (character->trading == true) {
    item = PacketReader::GetShort(reader);
    if ((character->trade_inventory).
        super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node._M_size <
        6) {
      bVar1 = Character::DelTradeItem(character,item);
      if (bVar1) {
        character->trade_agree = false;
        character->trade_partner->trade_agree = false;
        PacketBuilder::PacketBuilder
                  (&PStack_58,PACKET_TRADE,PACKET_REPLY,
                   ((character->trade_partner->trade_inventory).
                    super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                    _M_node._M_size +
                   (character->trade_inventory).
                   super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node
                   ._M_size) * 6 + 6);
        iVar2 = Character::PlayerID(character);
        PacketBuilder::AddShort(&PStack_58,iVar2);
        p_Var3 = (_List_node_base *)&character->trade_inventory;
        while (p_Var3 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                         &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var3 != (_List_node_base *)&character->trade_inventory) {
          iVar2 = *(int *)((long)&p_Var3[1]._M_next + 4);
          PacketBuilder::AddShort(&PStack_58,(int)*(short *)&p_Var3[1]._M_next);
          PacketBuilder::AddInt(&PStack_58,iVar2);
        }
        PacketBuilder::AddByte(&PStack_58,0xff);
        iVar2 = Character::PlayerID(character->trade_partner);
        PacketBuilder::AddShort(&PStack_58,iVar2);
        plVar4 = &character->trade_partner->trade_inventory;
        p_Var3 = (_List_node_base *)plVar4;
        while (p_Var3 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                         &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var3 != (_List_node_base *)plVar4) {
          iVar2 = *(int *)((long)&p_Var3[1]._M_next + 4);
          PacketBuilder::AddShort(&PStack_58,(int)*(short *)&p_Var3[1]._M_next);
          PacketBuilder::AddInt(&PStack_58,iVar2);
        }
        PacketBuilder::AddByte(&PStack_58,0xff);
        Character::Send(character,&PStack_58);
        Character::Send(character->trade_partner,&PStack_58);
        PacketBuilder::~PacketBuilder(&PStack_58);
      }
    }
  }
  return;
}

Assistant:

void Trade_Remove(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int itemid = reader.GetShort();

	if (character->trade_inventory.size() > 5)
	{
		return;
	}

	if (character->DelTradeItem(itemid))
	{
		character->trade_agree = false;
		character->trade_partner->trade_agree = false;

		PacketBuilder builder(PACKET_TRADE, PACKET_REPLY,
			6 + character->trade_inventory.size() * 6 + character->trade_partner->trade_inventory.size() * 6);

		builder.AddShort(character->PlayerID());
		UTIL_FOREACH(character->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		builder.AddShort(character->trade_partner->PlayerID());
		UTIL_FOREACH(character->trade_partner->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		character->Send(builder);
		character->trade_partner->Send(builder);
	}

}